

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_push_v(DisasContext *s,TCGv_i64 val)

{
  MemOp idx;
  TCGContext *tcg_ctx;
  MemOp aflag;
  TCGv_i64 ret;
  
  idx = s->dflag;
  tcg_ctx = s->uc->tcg_ctx;
  if (s->code64 == 0) {
    aflag = MO_32 - (s->ss32 == 0);
  }
  else {
    aflag = MO_64;
    idx = (idx != MO_16) + 1 + (uint)(idx != MO_16);
  }
  ret = s->A0;
  tcg_gen_subi_i64_x86_64(tcg_ctx,ret,tcg_ctx->cpu_regs[4],(long)(1 << ((byte)idx & 0x1f)));
  if (s->code64 == 0) {
    if (s->addseg != 0) {
      ret = s->tmp4;
      tcg_gen_mov_i64_x86_64(tcg_ctx,ret,s->A0);
    }
    gen_lea_v_seg(s,aflag,s->A0,2,-1);
  }
  gen_op_st_v(s,idx,val,s->A0);
  gen_op_mov_reg_v(s,aflag,4,ret);
  return;
}

Assistant:

static void gen_push_v(DisasContext *s, TCGv val)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    MemOp d_ot = mo_pushpop(s, s->dflag);
    MemOp a_ot = mo_stacksize(s);
    int size = 1 << d_ot;
    TCGv new_esp = s->A0;

    tcg_gen_subi_tl(tcg_ctx, s->A0, tcg_ctx->cpu_regs[R_ESP], size);

    if (!CODE64(s)) {
        if (s->addseg) {
            new_esp = s->tmp4;
            tcg_gen_mov_tl(tcg_ctx, new_esp, s->A0);
        }
        gen_lea_v_seg(s, a_ot, s->A0, R_SS, -1);
    }

    gen_op_st_v(s, d_ot, val, s->A0);
    gen_op_mov_reg_v(s, a_ot, R_ESP, new_esp);
}